

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_helpers.c
# Opt level: O0

int kvtree_atod(char *str,double *val)

{
  uint uVar1;
  int *piVar2;
  uint *puVar3;
  char *pcVar4;
  double dVar5;
  double value;
  double *val_local;
  char *str_local;
  
  if (str == (char *)0x0) {
    kvtree_err("kvtree_atod: Can\'t convert NULL string to double @ %s:%d",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_helpers.c"
               ,0x23);
    str_local._4_4_ = 1;
  }
  else if (val == (double *)0x0) {
    kvtree_err("kvtree_atod: NULL address to store value @ %s:%d",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_helpers.c"
               ,0x2b);
    str_local._4_4_ = 1;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    dVar5 = strtod(str,(char **)0x0);
    piVar2 = __errno_location();
    if (*piVar2 == 0) {
      *val = dVar5;
      str_local._4_4_ = 0;
    }
    else {
      puVar3 = (uint *)__errno_location();
      uVar1 = *puVar3;
      piVar2 = __errno_location();
      pcVar4 = strerror(*piVar2);
      kvtree_err("kvtree_atod: Invalid double: %s errno=%d %s @ %s:%d",str,(ulong)uVar1,pcVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_helpers.c"
                 ,0x39);
      str_local._4_4_ = 1;
    }
  }
  return str_local._4_4_;
}

Assistant:

int kvtree_atod(char* str, double* val)
{
  /* check that we have a string */
  if (str == NULL) {
    kvtree_err("kvtree_atod: Can't convert NULL string to double @ %s:%d",
            __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* check that we have a value to write to */
  if (val == NULL) {
    kvtree_err("kvtree_atod: NULL address to store value @ %s:%d",
            __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* convert string to double */
  errno = 0;
  double value = strtod(str, NULL);
  if (errno == 0) {
    /* got a valid double, set our output parameter */
    *val = value;
  } else {
    /* could not interpret value */
    kvtree_err("kvtree_atod: Invalid double: %s errno=%d %s @ %s:%d",
            str, errno, strerror(errno), __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  return KVTREE_SUCCESS;
}